

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

double __thiscall xt::vector::conj(vector *this,double __z)

{
  Object *in_RSI;
  double __z_00;
  double dVar1;
  double extraout_XMM0_Qa;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  Object local_30;
  
  empty();
  Object::Object(&local_30,in_RSI);
  dVar1 = conj(__z_00);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    dVar1 = extraout_XMM0_Qa;
  }
  return dVar1;
}

Assistant:

Vector conj(Object val) {
	return conj(empty(), val);
}